

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorrenderer.cpp
# Opt level: O0

int __thiscall EditorRenderer::handle(EditorRenderer *this,int e)

{
  int iVar1;
  int iVar2;
  int ret;
  int e_local;
  EditorRenderer *this_local;
  
  iVar1 = Fl_Gl_Window::handle(&this->super_Fl_Gl_Window,e);
  if ((e == 1) && (iVar2 = Fl::event_button(), iVar2 == 3)) {
    this->dragging = true;
    iVar2 = Fl::event_x_root();
    this->lockedMouseX = iVar2;
    iVar2 = Fl::event_y_root();
    this->lockedMouseY = iVar2;
    Fl_Window::cursor(this->mainWindow,FL_CURSOR_NONE);
  }
  else if ((e == 2) && (iVar2 = Fl::event_button(), iVar2 == 3)) {
    this->dragging = false;
    Fl_Window::cursor(this->mainWindow,FL_CURSOR_DEFAULT);
  }
  return iVar1;
}

Assistant:

int EditorRenderer::handle(int e)
{
	int ret = Fl_Gl_Window::handle(e);

	if (e == FL_PUSH && Fl::event_button() == 3)
	{
		dragging = true;
		lockedMouseX = Fl::event_x_root();
		lockedMouseY = Fl::event_y_root();
		mainWindow->cursor(FL_CURSOR_NONE);

	}
	else if (e == FL_RELEASE && Fl::event_button() == 3)
	{
		dragging = false;
		mainWindow->cursor(FL_CURSOR_DEFAULT);
	}


	return ret;
}